

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int luaB_loadstring(lua_State *L)

{
  int iVar1;
  char *def;
  char *chunkname;
  size_t l;
  char *local_28;
  size_t local_20;
  
  def = luaL_checklstring(L,1,&l);
  chunkname = luaL_optlstring(L,2,def,(size_t *)0x0);
  local_20 = l;
  local_28 = def;
  iVar1 = lua_load(L,getS,&local_28,chunkname);
  iVar1 = load_aux(L,iVar1);
  return iVar1;
}

Assistant:

static int luaB_loadstring(lua_State*L){
size_t l;
const char*s=luaL_checklstring(L,1,&l);
const char*chunkname=luaL_optstring(L,2,s);
return load_aux(L,luaL_loadbuffer(L,s,l,chunkname));
}